

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,sc_string_old *s)

{
  sc_string_rep *psVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  sc_string_rep *r;
  size_t sVar8;
  char *__dest;
  int iVar9;
  long *in_RDX;
  
  psVar1 = s->rep;
  sVar7 = strlen(psVar1->str);
  r = (sc_string_rep *)operator_new(0x10);
  lVar2 = *in_RDX;
  sVar8 = strlen(*(char **)(lVar2 + 8));
  iVar3 = (int)sVar7;
  uVar5 = (int)sVar8 + iVar3;
  uVar4 = (int)sVar8 + iVar3 + 0xf;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5;
  }
  r->ref_count = 1;
  iVar9 = (uVar4 & 0xfffffff0) + 0x10;
  r->alloc = iVar9;
  iVar6 = -1;
  if (-1 < iVar9) {
    iVar6 = iVar9;
  }
  __dest = (char *)operator_new__((long)iVar6);
  r->str = __dest;
  *__dest = '\0';
  strcpy(__dest,psVar1->str);
  strcpy(__dest + iVar3,*(char **)(lVar2 + 8));
  sc_string_old(this,r);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::operator+( const sc_string_old& s ) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + s.length() + 1 );
    strcpy( r->str, rep->str );
    strcpy( r->str + len, s.rep->str );
    return sc_string_old(r);
}